

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_cvt_2008_l_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  uint uVar1;
  int iVar2;
  uintptr_t unaff_retaddr;
  uint64_t local_20;
  uint64_t dt2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  local_20 = float64_to_int64_mips(fdt0,&(env->active_fpu).fp_status);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if (((uVar1 & 1) != 0) && (iVar2 = float64_is_any_nan(fdt0), iVar2 != 0)) {
    local_20 = 0;
  }
  update_fcr31(env,unaff_retaddr);
  return local_20;
}

Assistant:

uint64_t helper_float_cvt_2008_l_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t dt2;

    dt2 = float64_to_int64(fdt0, &env->active_fpu.fp_status);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float64_is_any_nan(fdt0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}